

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaAllocator_T::BindVulkanBuffer
          (VmaAllocator_T *this,VkDeviceMemory memory,VkDeviceSize memoryOffset,VkBuffer buffer,
          void *pNext)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  VkBindBufferMemoryInfoKHR bindBufferMemoryInfo;
  undefined4 local_58 [2];
  long local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  long local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  VkResult local_4;
  
  if (in_R8 == 0) {
    local_4 = (**(code **)(in_RDI + 0x1698))(*(undefined8 *)(in_RDI + 0x10),in_RCX,in_RSI,in_RDX);
  }
  else if ((((*(byte *)(in_RDI + 9) & 1) == 0) && (*(uint *)(in_RDI + 4) < 0x401000)) ||
          (*(long *)(in_RDI + 0x16f0) == 0)) {
    local_4 = VK_ERROR_EXTENSION_NOT_PRESENT;
  }
  else {
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    memset(local_58,0,0x28);
    local_58[0] = 0x3b9d2f48;
    local_50 = local_30;
    local_48 = local_28;
    local_40 = local_18;
    local_38 = local_20;
    local_4 = (**(code **)(in_RDI + 0x16f0))(*(undefined8 *)(in_RDI + 0x10),1,local_58);
  }
  return local_4;
}

Assistant:

VkResult VmaAllocator_T::BindVulkanBuffer(
    VkDeviceMemory memory,
    VkDeviceSize memoryOffset,
    VkBuffer buffer,
    const void* pNext)
{
    if(pNext != VMA_NULL)
    {
#if VMA_VULKAN_VERSION >= 1001000 || VMA_BIND_MEMORY2
        if((m_UseKhrBindMemory2 || m_VulkanApiVersion >= VK_MAKE_VERSION(1, 1, 0)) &&
            m_VulkanFunctions.vkBindBufferMemory2KHR != VMA_NULL)
        {
            VkBindBufferMemoryInfoKHR bindBufferMemoryInfo = { VK_STRUCTURE_TYPE_BIND_BUFFER_MEMORY_INFO_KHR };
            bindBufferMemoryInfo.pNext = pNext;
            bindBufferMemoryInfo.buffer = buffer;
            bindBufferMemoryInfo.memory = memory;
            bindBufferMemoryInfo.memoryOffset = memoryOffset;
            return (*m_VulkanFunctions.vkBindBufferMemory2KHR)(m_hDevice, 1, &bindBufferMemoryInfo);
        }
        else
#endif // #if VMA_VULKAN_VERSION >= 1001000 || VMA_BIND_MEMORY2
        {
            return VK_ERROR_EXTENSION_NOT_PRESENT;
        }
    }
    else
    {
        return (*m_VulkanFunctions.vkBindBufferMemory)(m_hDevice, buffer, memory, memoryOffset);
    }
}